

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int kinLsATimes(void *kinmem,N_Vector v,N_Vector z)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = kinLs_AccessLMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                             (KINMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                             ,(KINLsMem *)0x11540e);
  if (local_4 == 0) {
    local_4 = (**(code **)(in_stack_ffffffffffffffd0 + 0xa0))
                        (in_RSI,in_RDX,*(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x108),
                         in_stack_ffffffffffffffd0 + 0x70,
                         *(undefined8 *)(in_stack_ffffffffffffffd0 + 0xb0));
    *(long *)(in_stack_ffffffffffffffd0 + 0x68) = *(long *)(in_stack_ffffffffffffffd0 + 0x68) + 1;
  }
  return local_4;
}

Assistant:

int kinLsATimes(void* kinmem, N_Vector v, N_Vector z)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  int retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* call Jacobian-times-vector product routine
     (either user-supplied or internal DQ) */
  retval = kinls_mem->jtimes(v, z, kin_mem->kin_uu, &(kinls_mem->new_uu),
                             kinls_mem->jt_data);
  kinls_mem->njtimes++;
  return (retval);
}